

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

void __thiscall FIX::FieldMap::FieldMap(FieldMap *this,FieldMap *rhs)

{
  pointer pFVar1;
  int iVar2;
  
  this->_vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f5bc0;
  pFVar1 = (rhs->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rhs->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar1;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rhs->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (rhs->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (rhs->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_groups)._M_t._M_impl.super__Rb_tree_header,
             &(rhs->m_groups)._M_t._M_impl.super__Rb_tree_header);
  iVar2 = (rhs->m_order).m_delim;
  (this->m_order).m_mode = (rhs->m_order).m_mode;
  (this->m_order).m_delim = iVar2;
  (this->m_order).m_groupOrder.m_size = (rhs->m_order).m_groupOrder.m_size;
  (this->m_order).m_groupOrder.m_buffer = (rhs->m_order).m_groupOrder.m_buffer;
  (rhs->m_order).m_groupOrder.m_size = 0;
  (rhs->m_order).m_groupOrder.m_buffer = (int *)0x0;
  (this->m_order).m_largest = (rhs->m_order).m_largest;
  return;
}

Assistant:

FieldMap::FieldMap(FieldMap &&rhs)
    : m_fields(std::move(rhs.m_fields)),
      m_groups(std::move(rhs.m_groups)),
      m_order(std::move(rhs.m_order)) {}